

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

void __thiscall
wasm::RemoveUnusedBrs::sinkBlocks(wasm::Function*)::Sinker::visitBlock(wasm::Block__
          (void *this,Block *curr)

{
  Id IVar1;
  If *this_00;
  Index IVar2;
  Expression **ppEVar4;
  Expression *tree;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  Name target;
  Name target_00;
  Name target_01;
  char *pcVar3;
  _Storage<wasm::Type,_true> _Var5;
  
  if ((curr->name).super_IString.str._M_str == (char *)0x0) {
    return;
  }
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 1) {
    return;
  }
  ppEVar4 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            data;
  this_00 = (If *)*ppEVar4;
  IVar1 = (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id;
  if (IVar1 != IfId) {
    if (IVar1 != LoopId) {
      return;
    }
    *ppEVar4 = this_00->ifFalse;
    this_00->ifFalse = (Expression *)curr;
    _Var5 = (_Storage<wasm::Type,_true>)
            (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = _Var5;
    Block::finalize(curr,type_,Unknown);
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = _Var5;
    Loop::finalize((Loop *)this_00,type__00);
    goto LAB_00a988ee;
  }
  if ((((BranchSeeker *)this_00->condition)->
      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      ).
      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      .stack.usedFixed == 1) {
    return;
  }
  tree = (Expression *)(curr->name).super_IString.str._M_len;
  target.super_IString.str._M_str._0_1_ = 2;
  target.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
  target.super_IString.str._M_str._1_7_ = 0;
  pcVar3 = (char *)0x2;
  IVar2 = BranchUtils::BranchSeeker::count((BranchSeeker *)this_00->condition,tree,target);
  if (IVar2 != 0) {
    return;
  }
  if ((BranchSeeker *)this_00->ifFalse == (BranchSeeker *)0x0) {
LAB_00a98960:
    ppEVar4 = &this_00->ifTrue;
  }
  else {
    tree = (Expression *)(curr->name).super_IString.str._M_len;
    target_00.super_IString.str._M_str = pcVar3;
    target_00.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
    IVar2 = BranchUtils::BranchSeeker::count((BranchSeeker *)this_00->ifFalse,tree,target_00);
    if (IVar2 == 0) goto LAB_00a98960;
    tree = (Expression *)(curr->name).super_IString.str._M_len;
    target_01.super_IString.str._M_str = pcVar3;
    target_01.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
    IVar2 = BranchUtils::BranchSeeker::count((BranchSeeker *)this_00->ifTrue,tree,target_01);
    ppEVar4 = (Expression **)0x0;
    if (IVar2 == 0) {
      ppEVar4 = &this_00->ifFalse;
    }
  }
  if (ppEVar4 == (Expression **)0x0) {
    return;
  }
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0) {
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  }
  *(curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       *ppEVar4;
  *ppEVar4 = (Expression *)curr;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)tree;
  Block::finalize(curr,type__01,Unknown);
  type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)tree;
  If::finalize(this_00,type__02);
LAB_00a988ee:
  Walker<Sinker,_wasm::Visitor<Sinker,_void>_>::replaceCurrent
            ((Walker<Sinker,_wasm::Visitor<Sinker,_void>_> *)this,(Expression *)this_00);
  *(undefined1 *)((long)this + 0xd8) = 1;
  return;
}

Assistant:

void visitBlock(Block* curr) {
        // If the block has a single child which is a loop, and the block is
        // named, then it is the exit for the loop. It's better to move it into
        // the loop, where it can be better optimized by other passes. Similar
        // logic for ifs: if the block is an exit for the if, we can move the
        // block in, consider for example:
        //    (block $label
        //     (if (..condition1..)
        //      (block
        //       (br_if $label (..condition2..))
        //       (..code..)
        //      )
        //     )
        //    )
        // After also merging the blocks, we have
        //    (if (..condition1..)
        //     (block $label
        //      (br_if $label (..condition2..))
        //      (..code..)
        //     )
        //    )
        // which can be further optimized later.
        if (curr->name.is() && curr->list.size() == 1) {
          if (auto* loop = curr->list[0]->dynCast<Loop>()) {
            curr->list[0] = loop->body;
            loop->body = curr;
            curr->finalize(curr->type);
            loop->finalize();
            replaceCurrent(loop);
            worked = true;
          } else if (auto* iff = curr->list[0]->dynCast<If>()) {
            if (iff->condition->type == Type::unreachable) {
              // The block result type may not be compatible with the arm result
              // types since the unreachable If can satisfy any type of block.
              // Just leave this for DCE.
              return;
            }
            // The label can't be used in the condition.
            if (BranchUtils::BranchSeeker::count(iff->condition, curr->name) ==
                0) {
              // We can move the block into either arm, if there are no uses in
              // the other.
              Expression** target = nullptr;
              if (!iff->ifFalse || BranchUtils::BranchSeeker::count(
                                     iff->ifFalse, curr->name) == 0) {
                target = &iff->ifTrue;
              } else if (BranchUtils::BranchSeeker::count(iff->ifTrue,
                                                          curr->name) == 0) {
                target = &iff->ifFalse;
              }
              if (target) {
                curr->list[0] = *target;
                *target = curr;
                // The block used to contain the if, and may have changed type
                // from unreachable to none, for example, if the if has an
                // unreachable condition but the arm is not unreachable.
                curr->finalize();
                iff->finalize();
                replaceCurrent(iff);
                worked = true;
                // Note that the type might change, e.g. if the if condition is
                // unreachable but the block that was on the outside had a
                // break.
              }
            }
          }
        }
      }